

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O2

int omp_pause_resource_(kmp_pause_status_t kind,int device_num)

{
  int iVar1;
  code *UNRECOVERED_JUMPTABLE;
  
  if (device_num == -10) {
    iVar1 = __kmpc_pause_resource(kind);
    return iVar1;
  }
  UNRECOVERED_JUMPTABLE = (code *)dlsym(0,"tgt_pause_resource");
  if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(kind,device_num);
    return iVar1;
  }
  return 1;
}

Assistant:

int FTN_STDCALL FTN_PAUSE_RESOURCE(kmp_pause_status_t kind, int device_num) {
#ifdef KMP_STUB
  return 1; // just fail
#else
  if (device_num == KMP_HOST_DEVICE)
    return __kmpc_pause_resource(kind);
  else {
#if !KMP_OS_WINDOWS
    int (*fptr)(kmp_pause_status_t, int);
    if ((*(void **)(&fptr) = dlsym(RTLD_DEFAULT, "tgt_pause_resource")))
      return (*fptr)(kind, device_num);
    else
#endif
      return 1; // just fail if there is no libomptarget
  }
#endif
}